

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdProc.c
# Opt level: O0

int dsdKernelCheckContainment
              (Dsd_Manager_t *pDsdMan,Dsd_Node_t *pL,Dsd_Node_t *pH,Dsd_Node_t **pLarge,
              Dsd_Node_t **pSmall)

{
  int iVar1;
  int RetValue;
  DdNode *bSuppSmall;
  DdNode *bSuppLarge;
  DdManager *dd;
  Dsd_Node_t **pSmall_local;
  Dsd_Node_t **pLarge_local;
  Dsd_Node_t *pH_local;
  Dsd_Node_t *pL_local;
  Dsd_Manager_t *pDsdMan_local;
  
  bSuppLarge = &pDsdMan->dd->sentinel;
  dd = (DdManager *)pSmall;
  pSmall_local = pLarge;
  pLarge_local = (Dsd_Node_t **)pH;
  pH_local = pL;
  pL_local = (Dsd_Node_t *)pDsdMan;
  iVar1 = Extra_bddSuppCheckContainment
                    ((DdManager *)bSuppLarge,pL->S,pH->S,&bSuppSmall,
                     (DdNode **)&stack0xffffffffffffffb0);
  if (iVar1 == 0) {
    pDsdMan_local._4_4_ = 0;
  }
  else {
    if (pLarge_local[2] == (Dsd_Node_t *)bSuppSmall) {
      *pSmall_local = (Dsd_Node_t *)pLarge_local;
      *(Dsd_Node_t **)&dd->sentinel = pH_local;
    }
    else {
      *pSmall_local = pH_local;
      *(Dsd_Node_t ***)&dd->sentinel = pLarge_local;
    }
    pDsdMan_local._4_4_ = 1;
  }
  return pDsdMan_local._4_4_;
}

Assistant:

int dsdKernelCheckContainment( Dsd_Manager_t * pDsdMan, Dsd_Node_t * pL, Dsd_Node_t * pH, Dsd_Node_t ** pLarge, Dsd_Node_t ** pSmall )
{
    DdManager * dd = pDsdMan->dd;
    DdNode * bSuppLarge, * bSuppSmall;
    int RetValue;
    
    RetValue = Extra_bddSuppCheckContainment( dd, pL->S, pH->S, &bSuppLarge, &bSuppSmall );

    if ( RetValue == 0 ) 
        return 0;

    if ( pH->S == bSuppLarge )
    {
        *pLarge = pH;
        *pSmall = pL;
    }
    else // if ( pL->S == bSuppLarge )
    {
        *pLarge = pL;
        *pSmall = pH;
    }
    return 1;
}